

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cpp
# Opt level: O2

int LUDecompose(double **a,int n,double *vv,int *indx,double *pd)

{
  double **ppdVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  ulong unaff_RBP;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  dVar16 = 1.0;
  auVar17._8_8_ = 0x7fffffffffffffff;
  auVar17._0_8_ = 0x7fffffffffffffff;
  uVar9 = (ulong)(uint)n;
  uVar10 = 0;
  uVar7 = (ulong)(uint)(~(n >> 0x1f) & n);
  while( true ) {
    if (uVar10 == uVar7) {
      lVar12 = 1;
      for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
        for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          pdVar3 = a[uVar11];
          uVar13 = 0;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = pdVar3[uVar10];
          while (uVar11 != uVar13) {
            ppdVar1 = a + uVar13;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = pdVar3[uVar13];
            uVar13 = uVar13 + 1;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = (*ppdVar1)[uVar10];
            auVar19 = vfnmadd231sd_fma(auVar19,auVar22,auVar4);
          }
          pdVar3[uVar10] = auVar19._0_8_;
        }
        auVar15 = ZEXT816(0) << 0x40;
        for (uVar11 = uVar10; uVar11 != uVar9; uVar11 = uVar11 + 1) {
          pdVar3 = a[uVar11];
          uVar13 = 0;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = pdVar3[uVar10];
          while (uVar10 != uVar13) {
            ppdVar1 = a + uVar13;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = pdVar3[uVar13];
            uVar13 = uVar13 + 1;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = (*ppdVar1)[uVar10];
            auVar23 = vfnmadd231sd_fma(auVar23,auVar25,auVar2);
          }
          pdVar3[uVar10] = auVar23._0_8_;
          auVar19 = vandpd_avx(auVar23,auVar17);
          dVar18 = auVar19._0_8_ * vv[uVar11];
          dVar21 = auVar15._0_8_;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar18;
          uVar5 = vcmpsd_avx512f(auVar15,auVar24,6);
          bVar6 = (bool)((byte)uVar5 & 1);
          auVar15._0_8_ = (ulong)bVar6 * (long)dVar21 + (ulong)!bVar6 * (long)dVar18;
          auVar15._8_8_ = 0;
          if (dVar21 <= dVar18) {
            unaff_RBP = uVar11;
          }
          unaff_RBP = unaff_RBP & 0xffffffff;
        }
        iVar8 = (int)unaff_RBP;
        if (uVar10 != (unaff_RBP & 0xffffffff)) {
          for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
            pdVar3 = a[uVar10];
            dVar18 = a[iVar8][uVar11];
            a[iVar8][uVar11] = pdVar3[uVar11];
            pdVar3[uVar11] = dVar18;
          }
          dVar16 = -dVar16;
          vv[iVar8] = vv[uVar10];
        }
        indx[uVar10] = iVar8;
        dVar18 = a[uVar10][uVar10];
        if ((dVar18 == 0.0) && (!NAN(dVar18))) {
          dVar18 = 1e-20;
          a[uVar10][uVar10] = 1e-20;
        }
        if (uVar10 != n - 1) {
          for (lVar14 = lVar12; (int)lVar14 < n; lVar14 = lVar14 + 1) {
            a[lVar14][uVar10] = (1.0 / dVar18) * a[lVar14][uVar10];
          }
        }
        lVar12 = lVar12 + 1;
      }
      if (pd != (double *)0x0) {
        *pd = dVar16;
      }
      return 0;
    }
    auVar19 = ZEXT816(0) << 0x40;
    uVar11 = 0;
    while (uVar9 != uVar11) {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = a[uVar10][uVar11];
      uVar11 = uVar11 + 1;
      auVar4 = vandpd_avx(auVar20,auVar17);
      auVar19 = vmaxsd_avx(auVar4,auVar19);
    }
    dVar18 = auVar19._0_8_;
    if ((dVar18 == 0.0) && (!NAN(dVar18))) break;
    vv[uVar10] = 1.0 / dVar18;
    uVar10 = uVar10 + 1;
  }
  printf("singular matrix in routine LUDecompose");
  return 1;
}

Assistant:

int LUDecompose (double **a, int n, double *vv, int *indx, double *pd)
	/*   **a = the matrix whose LU-decomposition is wanted                    */
	/*     n = order of a                                                     */
	/*   *vv = work vector of size n (stores implicit scaling of each row)    */
	/* *indx => row permutation according to partial pivoting sequence        */
	/*   *pd => 1 if number of row interchanges was even, -1 if odd (NULL OK) */
{
	int			i, imax, j, k;
	double		big, dum, sum, temp, d;

	d = 1.0;
	for (i = 0; i < n; i++)
		{
		big = 0.0;
		for (j = 0; j < n; j++)
			{
			if ((temp = fabs(a[i][j])) > big)
				big = temp;
			}
		if (big == 0.0)
			{
			printf("singular matrix in routine LUDecompose");
			return ERROR;
			}
		vv[i] = ONE_POINT_ZERO / big;
		}
	for (j = 0; j < n; j++)
		{
		for (i = 0; i < j; i++)
			{
			sum = a[i][j];
			for (k = 0; k < i; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			}
		big = 0.0;
		for (i = j; i < n; i++)
			{
			sum = a[i][j];
			for (k = 0; k < j; k++)
				sum -= a[i][k] * a[k][j];
			a[i][j] = sum;
			dum = vv[i] * fabs(sum);
			if (dum >= big)
				{
				big = dum;
				imax = i;
				}
			}
		if (j != imax)
			{
			for (k = 0; k < n; k++)
				{
				dum = a[imax][k];
				a[imax][k] = a[j][k];
				a[j][k] = dum;
				}	
			d = -d;
			vv[imax] = vv[j];
			}
		indx[j] = imax;
		if (a[j][j] == 0.0)
			a[j][j] = TINY;
		if (j != n - 1)
			{
			dum = ONE_POINT_ZERO / (a[j][j]);
			for (i = j + 1; i < n; i++)
				a[i][j] *= dum;
			}
		}

	if (pd != NULL)
		*pd = d;
	return NO_ERROR;
}